

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_io.c
# Opt level: O1

int IDAGetIntegratorStats
              (void *ida_mem,long *nsteps,long *nrevals,long *nlinsetups,long *netfails,int *klast,
              int *kcur,sunrealtype *hinused,sunrealtype *hlast,sunrealtype *hcur,sunrealtype *tcur)

{
  int iVar1;
  
  if (ida_mem == (void *)0x0) {
    iVar1 = -0x14;
    IDAProcessError((IDAMem)0x0,-0x14,0x5f5,"IDAGetIntegratorStats",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_io.c"
                    ,"ida_mem = NULL illegal.");
  }
  else {
    *nsteps = *(long *)((long)ida_mem + 0x5b8);
    *nrevals = *(long *)((long)ida_mem + 0x5c0);
    *nlinsetups = *(long *)((long)ida_mem + 0x648);
    *netfails = *(long *)((long)ida_mem + 0x608);
    *klast = *(int *)((long)ida_mem + 0x4bc);
    *kcur = *(int *)((long)ida_mem + 0x4b8);
    *hinused = *(sunrealtype *)((long)ida_mem + 0x4d8);
    *hlast = *(sunrealtype *)((long)ida_mem + 0x4e8);
    *hcur = *(sunrealtype *)((long)ida_mem + 0x4e0);
    *tcur = *(sunrealtype *)((long)ida_mem + 0x4f8);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int IDAGetIntegratorStats(void* ida_mem, long int* nsteps, long int* nrevals,
                          long int* nlinsetups, long int* netfails, int* klast,
                          int* kcur, sunrealtype* hinused, sunrealtype* hlast,
                          sunrealtype* hcur, sunrealtype* tcur)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  *nsteps     = IDA_mem->ida_nst;
  *nrevals    = IDA_mem->ida_nre;
  *nlinsetups = IDA_mem->ida_nsetups;
  *netfails   = IDA_mem->ida_netf;
  *klast      = IDA_mem->ida_kused;
  *kcur       = IDA_mem->ida_kk;
  *hinused    = IDA_mem->ida_h0u;
  *hlast      = IDA_mem->ida_hused;
  *hcur       = IDA_mem->ida_hh;
  *tcur       = IDA_mem->ida_tn;

  return (IDA_SUCCESS);
}